

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCachePop(Parse *pParse)

{
  byte bVar1;
  int i;
  
  pParse->iCacheLevel = pParse->iCacheLevel + -1;
  bVar1 = pParse->nColCache;
  if (bVar1 != 0) {
    i = 0;
    do {
      if (pParse->iCacheLevel < pParse->aColCache[i].iLevel) {
        cacheEntryClear(pParse,i);
        bVar1 = pParse->nColCache;
      }
      else {
        i = i + 1;
      }
    } while (i < (int)(uint)bVar1);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCachePop(Parse *pParse){
  int i = 0;
  assert( pParse->iCacheLevel>=1 );
  pParse->iCacheLevel--;
#ifdef SQLITE_DEBUG
  if( pParse->db->flags & SQLITE_VdbeAddopTrace ){
    printf("POP  to %d\n", pParse->iCacheLevel);
  }
#endif
  while( i<pParse->nColCache ){
    if( pParse->aColCache[i].iLevel>pParse->iCacheLevel ){
      cacheEntryClear(pParse, i);
    }else{
      i++;
    }
  }
}